

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int xmlXPathNodeSetAddNs(xmlNodeSetPtr cur,xmlNodePtr node,xmlNsPtr ns)

{
  int iVar1;
  xmlNodePtr *ppxVar2;
  xmlNodePtr pxVar3;
  char *extra;
  long lVar4;
  
  if (node == (xmlNodePtr)0x0) {
    return -1;
  }
  if (cur == (xmlNodeSetPtr)0x0) {
    return -1;
  }
  if (ns == (xmlNsPtr)0x0) {
    return -1;
  }
  if (ns->type != XML_NAMESPACE_DECL) {
    return -1;
  }
  if (node->type != XML_ELEMENT_NODE) {
    return -1;
  }
  iVar1 = cur->nodeNr;
  if (0 < iVar1) {
    lVar4 = 0;
    do {
      pxVar3 = cur->nodeTab[lVar4];
      if (((pxVar3 != (xmlNodePtr)0x0) && (pxVar3->type == XML_NAMESPACE_DECL)) &&
         ((xmlNodePtr)pxVar3->_private == node)) {
        iVar1 = xmlStrEqual(ns->prefix,(xmlChar *)pxVar3->children);
        if (iVar1 != 0) {
          return 0;
        }
        iVar1 = cur->nodeNr;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar1);
  }
  if (cur->nodeMax == 0) {
    ppxVar2 = (xmlNodePtr *)(*xmlMalloc)(0x50);
    cur->nodeTab = ppxVar2;
    if (ppxVar2 != (xmlNodePtr *)0x0) {
      ppxVar2[8] = (xmlNodePtr)0x0;
      ppxVar2[9] = (xmlNodePtr)0x0;
      ppxVar2[6] = (xmlNodePtr)0x0;
      ppxVar2[7] = (xmlNodePtr)0x0;
      ppxVar2[4] = (xmlNodePtr)0x0;
      ppxVar2[5] = (xmlNodePtr)0x0;
      ppxVar2[2] = (xmlNodePtr)0x0;
      ppxVar2[3] = (xmlNodePtr)0x0;
      *ppxVar2 = (xmlNodePtr)0x0;
      ppxVar2[1] = (xmlNodePtr)0x0;
      cur->nodeMax = 10;
      goto LAB_001dd0f0;
    }
  }
  else {
    if (iVar1 != cur->nodeMax) {
LAB_001dd0f0:
      pxVar3 = xmlXPathNodeSetDupNs(node,ns);
      iVar1 = cur->nodeNr;
      cur->nodeNr = iVar1 + 1;
      cur->nodeTab[iVar1] = pxVar3;
      return 0;
    }
    if (9999999 < iVar1) {
      extra = "growing nodeset hit limit\n";
      goto LAB_001dd117;
    }
    ppxVar2 = (xmlNodePtr *)(*xmlRealloc)(cur->nodeTab,(long)(iVar1 * 2) << 3);
    if (ppxVar2 != (xmlNodePtr *)0x0) {
      cur->nodeMax = cur->nodeMax << 1;
      cur->nodeTab = ppxVar2;
      goto LAB_001dd0f0;
    }
  }
  extra = "growing nodeset\n";
LAB_001dd117:
  xmlXPathErrMemory((xmlXPathContextPtr)0x0,extra);
  return -1;
}

Assistant:

int
xmlXPathNodeSetAddNs(xmlNodeSetPtr cur, xmlNodePtr node, xmlNsPtr ns) {
    int i;


    if ((cur == NULL) || (ns == NULL) || (node == NULL) ||
        (ns->type != XML_NAMESPACE_DECL) ||
	(node->type != XML_ELEMENT_NODE))
	return(-1);

    /* @@ with_ns to check whether namespace nodes should be looked at @@ */
    /*
     * prevent duplicates
     */
    for (i = 0;i < cur->nodeNr;i++) {
        if ((cur->nodeTab[i] != NULL) &&
	    (cur->nodeTab[i]->type == XML_NAMESPACE_DECL) &&
	    (((xmlNsPtr)cur->nodeTab[i])->next == (xmlNsPtr) node) &&
	    (xmlStrEqual(ns->prefix, ((xmlNsPtr)cur->nodeTab[i])->prefix)))
	    return(0);
    }

    /*
     * grow the nodeTab if needed
     */
    if (cur->nodeMax == 0) {
        cur->nodeTab = (xmlNodePtr *) xmlMalloc(XML_NODESET_DEFAULT *
					     sizeof(xmlNodePtr));
	if (cur->nodeTab == NULL) {
	    xmlXPathErrMemory(NULL, "growing nodeset\n");
	    return(-1);
	}
	memset(cur->nodeTab, 0 ,
	       XML_NODESET_DEFAULT * (size_t) sizeof(xmlNodePtr));
        cur->nodeMax = XML_NODESET_DEFAULT;
    } else if (cur->nodeNr == cur->nodeMax) {
        xmlNodePtr *temp;

        if (cur->nodeMax >= XPATH_MAX_NODESET_LENGTH) {
            xmlXPathErrMemory(NULL, "growing nodeset hit limit\n");
            return(-1);
        }
	temp = (xmlNodePtr *) xmlRealloc(cur->nodeTab, cur->nodeMax * 2 *
				      sizeof(xmlNodePtr));
	if (temp == NULL) {
	    xmlXPathErrMemory(NULL, "growing nodeset\n");
	    return(-1);
	}
        cur->nodeMax *= 2;
	cur->nodeTab = temp;
    }
    /* TODO: Check memory error. */
    cur->nodeTab[cur->nodeNr++] = xmlXPathNodeSetDupNs(node, ns);
    return(0);
}